

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_cluster_on_connect(intptr_t uuid,void *udata)

{
  fio_protocol_s *protocol;
  fio_ch_set__ordered_s_ *local_28;
  fio_ch_set__ordered_s_ *pos_1;
  fio_ch_set__ordered_s_ *pos;
  void *udata_local;
  intptr_t uuid_local;
  
  cluster_data.uuid = uuid;
  fio_lock(&fio_postoffice.pubsub.lock);
  for (pos_1 = fio_postoffice.pubsub.channels.ordered;
      pos_1 != (fio_ch_set__ordered_s_ *)0x0 &&
      pos_1 < fio_postoffice.pubsub.channels.ordered + fio_postoffice.pubsub.channels.pos;
      pos_1 = pos_1 + 1) {
    if (pos_1->hash != 0) {
      fio_cluster_inform_root_about_channel(pos_1->obj,1);
    }
  }
  fio_unlock(&fio_postoffice.pubsub.lock);
  fio_lock(&fio_postoffice.patterns.lock);
  for (local_28 = fio_postoffice.patterns.channels.ordered;
      local_28 != (fio_ch_set__ordered_s_ *)0x0 &&
      local_28 < fio_postoffice.patterns.channels.ordered + fio_postoffice.patterns.channels.pos;
      local_28 = local_28 + 1) {
    if (local_28->hash != 0) {
      fio_cluster_inform_root_about_channel(local_28->obj,1);
    }
  }
  fio_unlock(&fio_postoffice.patterns.lock);
  protocol = fio_cluster_protocol_alloc(uuid,fio_cluster_client_handler,fio_cluster_client_sender);
  fio_attach(uuid,protocol);
  return;
}

Assistant:

static void fio_cluster_on_connect(intptr_t uuid, void *udata) {
  cluster_data.uuid = uuid;

  /* inform root about all existing channels */
  fio_lock(&fio_postoffice.pubsub.lock);
  FIO_SET_FOR_LOOP(&fio_postoffice.pubsub.channels, pos) {
    if (!pos->hash) {
      continue;
    }
    fio_cluster_inform_root_about_channel(pos->obj, 1);
  }
  fio_unlock(&fio_postoffice.pubsub.lock);
  fio_lock(&fio_postoffice.patterns.lock);
  FIO_SET_FOR_LOOP(&fio_postoffice.patterns.channels, pos) {
    if (!pos->hash) {
      continue;
    }
    fio_cluster_inform_root_about_channel(pos->obj, 1);
  }
  fio_unlock(&fio_postoffice.patterns.lock);

  fio_attach(uuid, fio_cluster_protocol_alloc(uuid, fio_cluster_client_handler,
                                              fio_cluster_client_sender));
  (void)udata;
}